

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O2

bool duckdb::ColumnCountResult::AddRow(ColumnCountResult *result,idx_t buffer_pos)

{
  LinePosition *pLVar1;
  idx_t iVar2;
  CSVReaderOptions *this;
  bool bVar3;
  ulong uVar4;
  idx_t iVar5;
  reference pvVar6;
  idx_t i;
  idx_t iVar7;
  LinesPerBoundary error_info;
  undefined7 uStack_130;
  bool mock;
  string csv_row;
  LinesPerBoundary lines_per_batch;
  CSVError error;
  FullLinePosition local_68;
  
  iVar7 = result->cur_buffer_idx;
  iVar5 = buffer_pos + 1;
  pLVar1 = &(result->super_ScannerResult).last_position;
  if ((result->super_ScannerResult).last_position.buffer_idx == iVar7) {
    uVar4 = iVar5 - pLVar1->buffer_pos;
  }
  else {
    uVar4 = ((result->super_ScannerResult).last_position.buffer_size + iVar5) -
            (result->super_ScannerResult).last_position.buffer_pos;
  }
  iVar2 = result->current_buffer_size;
  if ((buffer_pos != 0xffffffffffffffff) &&
     ((((result->super_ScannerResult).state_machine)->options->maximum_line_size).value < uVar4)) {
    LinesPerBoundary::LinesPerBoundary(&lines_per_batch);
    local_68.begin.buffer_idx = (result->super_ScannerResult).last_position.buffer_idx;
    local_68.begin.buffer_pos = pLVar1->buffer_pos;
    local_68.begin.buffer_size = (result->super_ScannerResult).last_position.buffer_size;
    mock = false;
    local_68.end.buffer_pos = iVar5;
    local_68.end.buffer_size = iVar2;
    local_68.end.buffer_idx = iVar7;
    FullLinePosition::
    ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
              (&csv_row,&local_68,&mock,&result->buffer_handles,true);
    this = ((result->super_ScannerResult).state_machine)->options;
    error_info.lines_in_batch = (idx_t)&csv_row;
    error_info.boundary_idx = lines_per_batch.lines_in_batch;
    CSVError::LineSizeError
              (&error,(CSVError *)this,(CSVReaderOptions *)lines_per_batch.boundary_idx,error_info,
               (string *)
               ((result->super_ScannerResult).last_position.buffer_idx *
                (this->buffer_size_option).value +
               (result->super_ScannerResult).last_position.buffer_pos),(idx_t)&this->file_path,
               (string *)CONCAT17(mock,uStack_130));
    CSVErrorHandler::Error(result->error_handler,&error,false);
    result->error = true;
    CSVError::~CSVError(&error);
    ::std::__cxx11::string::~string((string *)&csv_row);
  }
  InternalAddRow(result);
  (result->super_ScannerResult).last_position.buffer_pos = iVar5;
  (result->super_ScannerResult).last_position.buffer_size = iVar2;
  (result->super_ScannerResult).last_position.buffer_idx = iVar7;
  bVar3 = CSVStates::EmptyLastValue((result->super_ScannerResult).states);
  if (!bVar3) {
    iVar5 = result->result_position;
    iVar7 = iVar5;
    for (uVar4 = 0; uVar4 < iVar5 + 1; uVar4 = uVar4 + 1) {
      pvVar6 = vector<duckdb::ColumnCount,_true>::get<true>(&result->column_counts,iVar7);
      if (pvVar6->last_value_always_empty != true) break;
      pvVar6 = vector<duckdb::ColumnCount,_true>::get<true>(&result->column_counts,iVar7);
      pvVar6->last_value_always_empty = false;
      iVar5 = result->result_position;
      iVar7 = iVar7 - 1;
    }
  }
  uVar4 = result->result_position + 1;
  result->result_position = uVar4;
  return (result->super_ScannerResult).result_size <= uVar4;
}

Assistant:

bool ColumnCountResult::AddRow(ColumnCountResult &result, idx_t buffer_pos) {
	const LinePosition cur_position(result.cur_buffer_idx, buffer_pos + 1, result.current_buffer_size);
	if (cur_position - result.last_position > result.state_machine.options.maximum_line_size.GetValue() &&
	    buffer_pos != NumericLimits<idx_t>::Maximum()) {
		LinesPerBoundary lines_per_batch;
		FullLinePosition current_line_position;
		current_line_position.begin = result.last_position;
		current_line_position.end = cur_position;
		bool mock = false;
		string csv_row = current_line_position.ReconstructCurrentLine(mock, result.buffer_handles, true);
		auto error = CSVError::LineSizeError(
		    result.state_machine.options, lines_per_batch, csv_row,
		    result.last_position.GetGlobalPosition(result.state_machine.options.buffer_size_option.GetValue(), false),
		    result.state_machine.options.file_path);
		result.error_handler.Error(error);
		result.error = true;
	}
	result.InternalAddRow();
	result.last_position = cur_position;
	if (!result.states.EmptyLastValue()) {
		idx_t col_count_idx = result.result_position;
		for (idx_t i = 0; i < result.result_position + 1; i++) {
			if (!result.column_counts[col_count_idx].last_value_always_empty) {
				break;
			}
			result.column_counts[col_count_idx--].last_value_always_empty = false;
		}
	}
	result.result_position++;
	if (result.result_position >= result.result_size) {
		// We sniffed enough rows
		return true;
	}
	return false;
}